

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O1

DataAddress * __thiscall
Rml::DataModel::ResolveAddress
          (DataAddress *__return_storage_ptr__,DataModel *this,String *address_str,Element *element)

{
  pointer pDVar1;
  code *pcVar2;
  pointer pDVar3;
  int iVar4;
  DataModel *pDVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  DataModel *pDVar10;
  const_iterator cVar11;
  vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *pvVar12;
  DataAddress *pDVar13;
  pointer pbVar14;
  DataAddress *pDVar15;
  char cVar16;
  Node *pNVar17;
  int index;
  StringList list;
  DataAddress local_c8;
  int local_ac;
  DataModel *local_a8;
  int local_9c;
  undefined1 local_98 [32];
  vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> local_78;
  DataAddress *local_60;
  StringList local_58;
  String *local_40;
  pointer local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = this;
  local_60 = __return_storage_ptr__;
  local_40 = address_str;
  StringUtilities::ExpandString(&local_58,address_str,'.');
  local_78.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::reserve
            (&local_78,
             (long)local_58.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_38 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar14 = local_58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pvVar12 = &local_c8;
      if (pbVar14->_M_string_length == 0) goto LAB_001f9447;
      cVar16 = (char)pbVar14;
      lVar7 = ::std::__cxx11::string::find(cVar16,0x5b);
      pvVar12 = &local_c8;
      if (lVar7 == 0) goto LAB_001f9447;
      ::std::__cxx11::string::substr((ulong)local_98,(ulong)pbVar14);
      ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::
      emplace_back<std::__cxx11::string>
                ((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      if ((Element *)local_98._0_8_ != (Element *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      while (lVar7 != -1) {
        lVar8 = ::std::__cxx11::string::find(cVar16,0x5d);
        if (lVar8 == -1) {
          local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar6 = false;
        }
        else {
          ::std::__cxx11::string::substr((ulong)local_98,(ulong)pbVar14);
          local_ac = -1;
          __isoc99_sscanf(local_98._0_8_,"%d",&local_ac);
          iVar4 = local_ac;
          if ((Element *)local_98._0_8_ != (Element *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
          local_9c = iVar4;
          bVar6 = iVar4 >= 0;
          if (iVar4 < 0) {
            local_c8.
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_c8.
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_c8.
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          else {
            ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::
            emplace_back<int&>((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>
                                *)&local_78,&local_9c);
            lVar7 = ::std::__cxx11::string::find(cVar16,0x5b);
          }
        }
        if (!bVar6) goto LAB_001f9455;
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 != local_38);
  }
  if (((local_78.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_78.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) ||
      (((local_78.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_start)->name)._M_string_length == 0)) &&
     (bVar6 = Assert("RMLUI_ASSERT(!address.empty() && !address[0].name.empty())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataModel.cpp"
                     ,0x49), !bVar6)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_78.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar12 = &local_78;
LAB_001f9447:
  (pvVar12->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar12->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar12->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001f9455:
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(&local_78);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  pDVar5 = local_a8;
  pDVar1 = local_c8.
           super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (local_60->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    sVar9 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::findIdx<std::__cxx11::string>
                      ((Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                        *)&local_a8->variables,
                       &(local_c8.
                         super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->name);
    pDVar15 = local_60;
    if ((pDVar5->variables).mKeyVals + sVar9 == (Node *)(pDVar5->variables).mInfo) {
      while ((local_98._0_8_ = element, pDVar13 = pDVar15, element != (Element *)0x0 &&
             (pDVar10 = Element::GetDataModel(element), pDVar10 == local_a8))) {
        sVar9 = robin_hood::detail::
                Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
                ::findIdx<Rml::Element*>
                          ((Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
                            *)&pDVar5->aliases,(Element **)local_98);
        pNVar17 = (local_a8->aliases).mKeyVals + sVar9;
        if ((pNVar17 != (Node *)(local_a8->aliases).mInfo) &&
           (cVar11 = itlib::
                     flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>
                     ::find<std::__cxx11::string>
                               ((flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>
                                 *)&(pNVar17->mData).second,&pDVar1->name),
           pDVar3 = local_c8.
                    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
           cVar11._M_current !=
           *(pointer *)
            ((long)&(pNVar17->mData).second.m_container.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8))) {
          pDVar1 = ((cVar11._M_current)->second).
                   super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((pDVar1 != ((cVar11._M_current)->second).
                         super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish) &&
             ((pDVar1->name)._M_string_length != 0)) {
            ::std::__cxx11::string::_M_assign
                      ((string *)
                       local_c8.
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            pDVar3->index = pDVar1->index;
            ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<Rml::DataAddressEntry_const*,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>
                      ((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)
                       &local_c8,
                       local_c8.
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
                       ((cVar11._M_current)->second).
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
                       ((cVar11._M_current)->second).
                       super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            (pDVar15->
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
            _M_impl.super__Vector_impl_data._M_start =
                 local_c8.
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (pDVar15->
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
            _M_impl.super__Vector_impl_data._M_finish =
                 local_c8.
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (pDVar15->
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_c8.
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            pDVar13 = &local_c8;
          }
          goto LAB_001f956c;
        }
        element = Element::GetParentNode((Element *)local_98._0_8_);
      }
      Log::Message(LT_WARNING,"Could not find variable name \'%s\' in data model.",
                   (local_40->_M_dataplus)._M_p);
LAB_001f956c:
      (pDVar13->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar13->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar13->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_001f957a;
    }
    (local_60->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  (local_60->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
  _M_impl.super__Vector_impl_data._M_finish =
       local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (local_60->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar15 = local_60;
LAB_001f957a:
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(&local_c8);
  return pDVar15;
}

Assistant:

DataAddress DataModel::ResolveAddress(const String& address_str, Element* element) const
{
	DataAddress address = ParseAddress(address_str);

	if (address.empty())
		return address;

	const String& first_name = address.front().name;

	auto it = variables.find(first_name);
	if (it != variables.end())
		return address;

	// Look for a variable alias for the first name.

	Element* ancestor = element;
	while (ancestor && ancestor->GetDataModel() == this)
	{
		auto it_element = aliases.find(ancestor);
		if (it_element != aliases.end())
		{
			const auto& alias_names = it_element->second;
			auto it_alias_name = alias_names.find(first_name);
			if (it_alias_name != alias_names.end())
			{
				const DataAddress& replace_address = it_alias_name->second;
				if (replace_address.empty() || replace_address.front().name.empty())
				{
					// Variable alias is invalid
					return DataAddress();
				}

				// Insert the full alias address, replacing the first element.
				address[0] = replace_address[0];
				address.insert(address.begin() + 1, replace_address.begin() + 1, replace_address.end());
				return address;
			}
		}

		ancestor = ancestor->GetParentNode();
	}

	Log::Message(Log::LT_WARNING, "Could not find variable name '%s' in data model.", address_str.c_str());

	return DataAddress();
}